

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint64_t pmxevtyper_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  uint64_t uVar1;
  uint8_t in_DL;
  
  uVar1 = pmevtyper_read(env,(ARMCPRegInfo_conflict *)(ulong)((uint)(env->cp15).c9_pmselr & 0x1f),
                         in_DL);
  return uVar1;
}

Assistant:

static uint64_t pmxevtyper_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    return pmevtyper_read(env, ri, env->cp15.c9_pmselr & 31);
}